

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_adj(Omega_h *this,Mesh *mesh,Int from_dim,Int to_dim,Read<signed_char> *from_marked)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Read<signed_char> RVar2;
  Read<signed_char> local_58 [2];
  Read<signed_char> local_38;
  Read<signed_char> *local_28;
  Read<signed_char> *from_marked_local;
  Int to_dim_local;
  Int from_dim_local;
  Mesh *mesh_local;
  
  local_28 = from_marked;
  from_marked_local._0_4_ = to_dim;
  from_marked_local._4_4_ = from_dim;
  _to_dim_local = mesh;
  mesh_local = (Mesh *)this;
  if (from_dim == to_dim) {
    Read<signed_char>::Read((Read<signed_char> *)this,from_marked);
    pvVar1 = extraout_RDX;
  }
  else if (from_dim < to_dim) {
    Read<signed_char>::Read(&local_38,from_marked);
    mark_up(this,mesh,from_dim,to_dim,&local_38);
    Read<signed_char>::~Read(&local_38);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (from_dim <= to_dim) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
           ,0x45);
    }
    Read<signed_char>::Read(local_58,from_marked);
    mark_down(this,mesh,from_dim,to_dim,local_58);
    Read<signed_char>::~Read(local_58);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_adj(Mesh* mesh, Int from_dim, Int to_dim, Read<I8> from_marked) {
  if (from_dim == to_dim) return from_marked;
  if (from_dim < to_dim) return mark_up(mesh, from_dim, to_dim, from_marked);
  if (from_dim > to_dim) return mark_down(mesh, from_dim, to_dim, from_marked);
  OMEGA_H_NORETURN(Read<I8>());
}